

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall mock_buffer<char>::mock_buffer(mock_buffer<char> *this,char *data,size_t capacity)

{
  (this->super_basic_buffer<char>).capacity_ = 0;
  (this->super_basic_buffer<char>).ptr_ = (char *)0x0;
  (this->super_basic_buffer<char>).size_ = 0;
  (this->super_basic_buffer<char>)._vptr_basic_buffer = (_func_int **)&PTR_grow_001b6888;
  testing::internal::FunctionMocker<void_(unsigned_long)>::FunctionMocker(&this->gmock1_do_grow_94);
  (this->super_basic_buffer<char>).ptr_ = data;
  (this->super_basic_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

mock_buffer(T *data, std::size_t capacity) { this->set(data, capacity); }